

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar m;
  secp256k1_ge q;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_ge local_78;
  
  if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_verify_cold_3();
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_verify_cold_2();
  }
  else {
    if (pubkey != (secp256k1_pubkey *)0x0) {
      secp256k1_scalar_set_b32(&local_98,msghash32,(int *)0x0);
      local_b8.d[0] = *(uint64_t *)sig->data;
      local_b8.d[1] = *(uint64_t *)(sig->data + 8);
      local_b8.d[2] = *(uint64_t *)(sig->data + 0x10);
      local_b8.d[3] = *(uint64_t *)(sig->data + 0x18);
      local_d8.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_d8.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_d8.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_d8.d[3] = *(uint64_t *)(sig->data + 0x38);
      uVar1 = -(int)((long)local_d8.d[3] >> 0x3f);
      uVar3 = uVar1 ^ 1;
      uVar4 = uVar3;
      if (local_d8.d[2] == 0xffffffffffffffff) {
        uVar4 = 0;
      }
      if (0x5d576e7357a4501c < local_d8.d[1]) {
        uVar3 = 0;
      }
      uVar3 = (uVar3 | uVar4 | local_d8.d[3] < 0x7fffffffffffffff) ^ 1;
      uVar4 = 0;
      if (0xdfe92f46681b20a0 < local_d8.d[0]) {
        uVar4 = uVar3;
      }
      if (0x5d576e7357a4501d < local_d8.d[1]) {
        uVar4 = uVar3;
      }
      if (uVar4 != 0 || uVar1 != 0) {
        return 0;
      }
      iVar2 = secp256k1_pubkey_load(ctx,&local_78,pubkey);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = secp256k1_ecdsa_sig_verify(&local_b8,&local_d8,&local_78,&local_98);
      return iVar2;
    }
    secp256k1_ecdsa_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}